

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

btVector3 __thiscall
btSoftClusterCollisionShape::localGetSupportingVertex
          (btSoftClusterCollisionShape *this,btVector3 *vec)

{
  int iVar1;
  Node **ppNVar2;
  btVector3 *in_RDI;
  btScalar bVar3;
  btScalar k;
  int ni;
  int i;
  int j;
  btScalar d;
  Node **n;
  btVector3 *in_stack_ffffffffffffffa8;
  int local_3c;
  int local_38;
  float local_34;
  
  ppNVar2 = btAlignedObjectArray<btSoftBody::Node_*>::operator[]
                      ((btAlignedObjectArray<btSoftBody::Node_*> *)
                       (*(long *)(in_RDI[4].m_floats + 2) + 0x20),0);
  local_34 = btDot(in_RDI,in_stack_ffffffffffffffa8);
  local_38 = 0;
  local_3c = 1;
  iVar1 = btAlignedObjectArray<btSoftBody::Node_*>::size
                    ((btAlignedObjectArray<btSoftBody::Node_*> *)
                     (*(long *)(in_RDI[4].m_floats + 2) + 0x20));
  for (; local_3c < iVar1; local_3c = local_3c + 1) {
    bVar3 = btDot(in_RDI,in_stack_ffffffffffffffa8);
    if (local_34 < bVar3) {
      local_38 = local_3c;
      local_34 = bVar3;
    }
  }
  return (btVector3)*&(ppNVar2[local_38]->m_x).m_floats;
}

Assistant:

virtual btVector3	localGetSupportingVertex(const btVector3& vec) const
	{
		btSoftBody::Node* const *						n=&m_cluster->m_nodes[0];
		btScalar										d=btDot(vec,n[0]->m_x);
		int												j=0;
		for(int i=1,ni=m_cluster->m_nodes.size();i<ni;++i)
		{
			const btScalar	k=btDot(vec,n[i]->m_x);
			if(k>d) { d=k;j=i; }
		}
		return(n[j]->m_x);
	}